

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.cpp
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __uniq_ptr_data<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>,_true,_true>
  _Var3;
  long lVar4;
  _Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_> *this;
  size_t in_RSI;
  ProducerTask *pPVar5;
  byte bVar6;
  jthread listener_thread;
  jthread listener2_thread;
  jthread producer_thread;
  long *local_9dd0;
  Queue<(anonymous_namespace)::Action> queue;
  ListenerTask listener_task;
  ProducerTask producer_task;
  ListenerTaskTwo listener_task2;
  
  bVar6 = 0;
  producer_task.r.rd.field_0._M_mt._M_x[4] = 0;
  producer_task.r.rd.field_0._M_mt._M_x[5] = 0;
  producer_task.r.rd.field_0._M_mt._M_x[2] = 0;
  producer_task.r.rd.field_0._M_mt._M_x[3] = 0;
  producer_task.r.rd.field_0.field_0._M_file = (void *)0x0;
  producer_task.r.rd.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  producer_task.actions._M_elems[4] = ACTION_1;
  producer_task.actions._M_elems[5] = ACTION_1;
  producer_task.actions._M_elems[6] = ACTION_1;
  producer_task._28_4_ = 0;
  producer_task.actions._M_elems[0] = ACTION_1;
  producer_task.actions._M_elems[1] = ACTION_1;
  producer_task.actions._M_elems[2] = ACTION_1;
  producer_task.actions._M_elems[3] = ACTION_1;
  std::_Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>::
  _M_initialize_map((_Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
                     *)&producer_task,in_RSI);
  queue.queue_manipulator._M_t.
  super___uniq_ptr_impl<mq::BaseQueueManipulator<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueueManipulator<(anonymous_namespace)::Action>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_mq::BaseQueueManipulator<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueueManipulator<(anonymous_namespace)::Action>_>_>
  .super__Head_base<0UL,_mq::BaseQueueManipulator<(anonymous_namespace)::Action>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<mq::BaseQueueManipulator<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueueManipulator<(anonymous_namespace)::Action>_>,_true,_true>
                  )operator_new(0x10);
  *(undefined4 *)
   ((long)queue.queue_manipulator._M_t.
          super___uniq_ptr_impl<mq::BaseQueueManipulator<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueueManipulator<(anonymous_namespace)::Action>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_mq::BaseQueueManipulator<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueueManipulator<(anonymous_namespace)::Action>_>_>
          .super__Head_base<0UL,_mq::BaseQueueManipulator<(anonymous_namespace)::Action>_*,_false>.
          _M_head_impl + 8) = 1;
  *(undefined ***)
   queue.queue_manipulator._M_t.
   super___uniq_ptr_impl<mq::BaseQueueManipulator<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueueManipulator<(anonymous_namespace)::Action>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_mq::BaseQueueManipulator<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueueManipulator<(anonymous_namespace)::Action>_>_>
   .super__Head_base<0UL,_mq::BaseQueueManipulator<(anonymous_namespace)::Action>_*,_false>.
   _M_head_impl = &PTR_pop_00106c10;
  _Var3.
  super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
  .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl =
       (__uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
        )operator_new(0x58);
  *(undefined ***)
   _Var3.
   super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
   .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl =
       &PTR_pop_front_00106c80;
  this = (_Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
          *)((long)_Var3.
                   super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                   .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>.
                   _M_head_impl + 8);
  *(undefined8 *)
   ((long)_Var3.
          super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl
   + 8) = 0;
  *(undefined8 *)
   ((long)_Var3.
          super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl
   + 0x10) = 0;
  *(undefined8 *)
   ((long)_Var3.
          super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl
   + 0x18) = 0;
  *(undefined8 *)
   ((long)_Var3.
          super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl
   + 0x20) = 0;
  *(undefined8 *)
   ((long)_Var3.
          super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl
   + 0x28) = 0;
  *(undefined8 *)
   ((long)_Var3.
          super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl
   + 0x30) = 0;
  *(undefined8 *)
   ((long)_Var3.
          super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl
   + 0x38) = 0;
  *(undefined8 *)
   ((long)_Var3.
          super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl
   + 0x40) = 0;
  *(undefined8 *)
   ((long)_Var3.
          super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl
   + 0x48) = 0;
  *(undefined8 *)
   ((long)_Var3.
          super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
          .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl
   + 0x50) = 0;
  std::_Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>::
  _M_initialize_map(this,in_RSI);
  if (producer_task.actions._M_elems._0_8_ != 0) {
    listener_task.r.rd.field_0.field_0._M_file = (this->_M_impl).super__Deque_impl_data._M_map;
    listener_task.r.rd.field_0.field_0._M_func =
         (_func_result_type_void_ptr *)
         *(undefined8 *)
          ((long)_Var3.
                 super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                 .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>.
                 _M_head_impl + 0x10);
    uVar1 = *(undefined8 *)
             ((long)_Var3.
                    super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                    .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>.
                    _M_head_impl + 0x18);
    uVar2 = *(undefined8 *)
             ((long)_Var3.
                    super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                    .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>.
                    _M_head_impl + 0x20);
    producer_task.r.rd.field_0.field_0._M_file =
         (void *)*(undefined8 *)
                  ((long)_Var3.
                         super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                         .
                         super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>
                         ._M_head_impl + 0x28);
    producer_task.r.rd.field_0.field_0._M_func =
         (_func_result_type_void_ptr *)
         *(undefined8 *)
          ((long)_Var3.
                 super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                 .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>.
                 _M_head_impl + 0x30);
    producer_task.r.rd.field_0._M_mt._M_x[2] =
         *(unsigned_long *)
          ((long)_Var3.
                 super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                 .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>.
                 _M_head_impl + 0x38);
    producer_task.r.rd.field_0._M_mt._M_x[3] =
         *(unsigned_long *)
          ((long)_Var3.
                 super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                 .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>.
                 _M_head_impl + 0x40);
    producer_task.r.rd.field_0._M_mt._M_x[4] =
         *(unsigned_long *)
          ((long)_Var3.
                 super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                 .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>.
                 _M_head_impl + 0x48);
    producer_task.r.rd.field_0._M_mt._M_x[5] =
         *(unsigned_long *)
          ((long)_Var3.
                 super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
                 .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>.
                 _M_head_impl + 0x50);
    pPVar5 = &producer_task;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      (this->_M_impl).super__Deque_impl_data._M_map = *(_Map_pointer *)(pPVar5->actions)._M_elems;
      pPVar5 = (ProducerTask *)((long)pPVar5 + (ulong)bVar6 * -0x10 + 8);
      this = (_Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
              *)((long)this + ((ulong)bVar6 * -2 + 1) * 8);
    }
    producer_task.actions._M_elems[2] = (Action)listener_task.r.rd.field_0._M_mt._M_x[1];
    producer_task.actions._M_elems[3] = (Action)(listener_task.r.rd.field_0._M_mt._M_x[1] >> 0x20);
    producer_task.actions._M_elems[4] = (Action)uVar1;
    producer_task.actions._M_elems[5] = (Action)((ulong)uVar1 >> 0x20);
    producer_task.actions._M_elems[6] = (Action)uVar2;
    producer_task._28_4_ = SUB84((ulong)uVar2 >> 0x20,0);
    producer_task.actions._M_elems._0_8_ = listener_task.r.rd.field_0.field_0._M_file;
  }
  queue.mutex.super___mutex_base._M_mutex.__align = 0;
  queue.mutex.super___mutex_base._M_mutex._8_8_ = 0;
  queue.mutex.super___mutex_base._M_mutex._16_8_ = 0;
  queue.mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  queue.mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  queue.max_size = 100;
  queue.msg_queue._M_t.
  super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
  .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>._M_head_impl =
       (__uniq_ptr_data<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>,_true,_true>
        )(__uniq_ptr_data<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>,_true,_true>
          )_Var3.
           super___uniq_ptr_impl<mq::BaseQueue<(anonymous_namespace)::Action>,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_std::default_delete<mq::BaseQueue<(anonymous_namespace)::Action>_>_>
           .super__Head_base<0UL,_mq::BaseQueue<(anonymous_namespace)::Action>_*,_false>.
           _M_head_impl;
  sem::Semaphore::Semaphore(&queue.count_full,100,0);
  sem::Semaphore::Semaphore(&queue.count_empty,100,100);
  std::deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>::~deque
            ((deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_> *
             )&producer_task);
  producer_task.actions._M_elems[4] = ACTION_5;
  producer_task.actions._M_elems[5] = ACTION_6;
  producer_task.actions._M_elems[6] = ACTION_7;
  producer_task.actions._M_elems[0] = ACTION_1;
  producer_task.actions._M_elems[1] = ACTION_2;
  producer_task.actions._M_elems[2] = ACTION_3;
  producer_task.actions._M_elems[3] = ACTION_4;
  anon_unknown.dwarf_9c2a::RandomElementGetter::RandomElementGetter(&producer_task.r,3,1);
  anon_unknown.dwarf_9c2a::RandomElementGetter::RandomElementGetter(&producer_task.r_element,7,0);
  producer_task.q = &queue;
  anon_unknown.dwarf_9c2a::RandomElementGetter::RandomElementGetter(&listener_task.r,5,1);
  listener_task.q = &queue;
  anon_unknown.dwarf_9c2a::RandomElementGetter::RandomElementGetter(&listener_task2.r,6,3);
  listener_task2.q = &queue;
  std::stop_source::stop_source(&producer_thread._M_stop_source);
  producer_thread._M_thread._M_id._M_thread = (id)0;
  listener_thread._M_stop_source._M_state._M_ptr = (_Stop_state_ref)operator_new(0x10);
  *(undefined ***)listener_thread._M_stop_source._M_state._M_ptr = &PTR___State_00106d00;
  ((_Stop_state_t *)listener_thread._M_stop_source._M_state._M_ptr)->_M_head =
       (_Stop_cb *)&producer_task;
  std::thread::_M_start_thread(&producer_thread._M_thread,&listener_thread,0);
  if (listener_thread._M_stop_source._M_state._M_ptr != (_Stop_state_t *)0x0) {
    (**(code **)(*(long *)listener_thread._M_stop_source._M_state._M_ptr + 8))();
  }
  std::stop_source::stop_source(&listener_thread._M_stop_source);
  listener_thread._M_thread._M_id._M_thread = (id)0;
  listener2_thread._M_stop_source._M_state._M_ptr = (_Stop_state_ref)operator_new(0x10);
  *(undefined ***)listener2_thread._M_stop_source._M_state._M_ptr = &PTR___State_00106d40;
  ((_Stop_state_t *)listener2_thread._M_stop_source._M_state._M_ptr)->_M_head =
       (_Stop_cb *)&listener_task;
  std::thread::_M_start_thread(&listener_thread._M_thread,&listener2_thread,0);
  if (listener2_thread._M_stop_source._M_state._M_ptr != (_Stop_state_t *)0x0) {
    (**(code **)(*(long *)listener2_thread._M_stop_source._M_state._M_ptr + 8))();
  }
  std::stop_source::stop_source(&listener2_thread._M_stop_source);
  listener2_thread._M_thread._M_id._M_thread = (id)0;
  local_9dd0 = (long *)operator_new(0x10);
  *local_9dd0 = (long)&PTR___State_00106d80;
  local_9dd0[1] = (long)&listener_task2;
  std::thread::_M_start_thread(&listener2_thread._M_thread,&local_9dd0,0);
  if (local_9dd0 != (long *)0x0) {
    (**(code **)(*local_9dd0 + 8))();
  }
  std::jthread::~jthread(&listener2_thread);
  std::jthread::~jthread(&listener_thread);
  std::jthread::~jthread(&producer_thread);
  std::random_device::~random_device((random_device *)&listener_task2);
  std::random_device::~random_device((random_device *)&listener_task);
  anon_unknown.dwarf_9c2a::ProducerTask::~ProducerTask(&producer_task);
  mq::Queue<(anonymous_namespace)::Action>::~Queue(&queue);
  return 0;
}

Assistant:

int main() {
    mq::Queue queue{std::deque<Action>{}, 100};  // NOLINT
    ProducerTask producer_task{queue};
    ListenerTask listener_task{queue};
    ListenerTaskTwo listener_task2{queue};

    std::jthread producer_thread{std::ref(producer_task)};
    std::jthread listener_thread{std::ref(listener_task)};
    std::jthread listener2_thread{std::ref(listener_task2)};
}